

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void qt_painterpath_isect_curve(QBezier *bezier,QPointF *pt,int *winding,int depth)

{
  int in_ECX;
  int iVar1;
  QPointF *in_RDX;
  QBezier *in_RSI;
  long in_FS_OFFSET;
  QBezier *pQVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal lower_bound;
  qreal x;
  qreal y;
  pair<QBezier,_QBezier> halves;
  QRectF bounds;
  QBezier *this;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 local_d8 [48];
  QBezier *in_stack_ffffffffffffff58;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QBezier *)QPointF::y((QPointF *)in_RSI);
  qVar3 = QPointF::x((QPointF *)in_RSI);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  local_28.w = -NAN;
  local_28.h = -NAN;
  QBezier::bounds(pQVar2);
  this = pQVar2;
  qVar4 = QRectF::y(&local_28);
  if (qVar4 <= (double)pQVar2) {
    pQVar2 = this;
    qVar4 = QRectF::y(&local_28);
    iVar1 = (int)((ulong)pQVar2 >> 0x20);
    qVar5 = QRectF::height(&local_28);
    if ((double)this < qVar4 + qVar5) {
      if ((in_ECX == 0x20) ||
         ((qVar4 = QRectF::width(&local_28), qVar4 < 0.001 &&
          (qVar4 = QRectF::height(&local_28), qVar4 < 0.001)))) {
        local_38 = QBezier::pt1(this);
        qVar4 = QPointF::x(&local_38);
        if (qVar4 <= qVar3) {
          local_48 = QBezier::pt4(this);
          qVar3 = QPointF::y(&local_48);
          local_58 = QBezier::pt1(this);
          qVar4 = QPointF::y(&local_58);
          iVar1 = -1;
          if (qVar4 < qVar3) {
            iVar1 = 1;
          }
          *(int *)&in_RDX->xp = iVar1 + *(int *)&in_RDX->xp;
        }
      }
      else {
        memset(local_d8,0xff,0x80);
        QBezier::split(in_stack_ffffffffffffff58);
        qt_painterpath_isect_curve
                  (in_RSI,in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffff08),iVar1);
        qt_painterpath_isect_curve
                  (in_RSI,in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffff08),iVar1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_painterpath_isect_curve(const QBezier &bezier, const QPointF &pt,
                                       int *winding, int depth = 0)
{
    qreal y = pt.y();
    qreal x = pt.x();
    QRectF bounds = bezier.bounds();

    // potential intersection, divide and try again...
    // Please note that a sideeffect of the bottom exclusion is that
    // horizontal lines are dropped, but this is correct according to
    // scan conversion rules.
    if (y >= bounds.y() && y < bounds.y() + bounds.height()) {

        // hit lower limit... This is a rough threshold, but its a
        // tradeoff between speed and precision.
        const qreal lower_bound = qreal(.001);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound)) {
            // We make the assumption here that the curve starts to
            // approximate a line after while (i.e. that it doesn't
            // change direction drastically during its slope)
            if (bezier.pt1().x() <= x) {
                (*winding) += (bezier.pt4().y() > bezier.pt1().y() ? 1 : -1);
            }
            return;
        }

        // split curve and try again...
        const auto halves = bezier.split();
        qt_painterpath_isect_curve(halves.first,  pt, winding, depth + 1);
        qt_painterpath_isect_curve(halves.second, pt, winding, depth + 1);
    }
}